

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunction_Derive.cpp
# Opt level: O2

void __thiscall
chrono::ChFunction_Derive::ArchiveOUT(ChFunction_Derive *this,ChArchiveOut *marchive)

{
  ChNameValue<int> local_48;
  ChNameValue<std::shared_ptr<chrono::ChFunction>_> local_30;
  
  ChArchiveOut::VersionWrite<chrono::ChFunction_Derive>(marchive);
  ChFunction::ArchiveOUT(&this->super_ChFunction,marchive);
  local_30._value = &this->fa;
  local_30._name = "fa";
  local_30._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_30);
  local_48._value = &this->order;
  local_48._name = "order";
  local_48._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_48);
  return;
}

Assistant:

void ChFunction_Derive::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChFunction_Derive>();
    // serialize parent class
    ChFunction::ArchiveOUT(marchive);
    // serialize all member data:
    marchive << CHNVP(fa);
    marchive << CHNVP(order);
}